

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

size_t chacha20poly1305_decrypt
                 (ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,void *iv,void *aad
                 ,size_t aadlen)

{
  uint uVar1;
  ptls_aead_context_t *local_60;
  size_t ret;
  uint8_t tag [16];
  chacha20poly1305_context_t *ctx;
  void *aad_local;
  void *iv_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  ptls_aead_context_t *_ctx_local;
  
  if (inlen < 0x10) {
    _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
  }
  else {
    tag._8_8_ = _ctx;
    chacha20poly1305_init(_ctx,iv,aad,aadlen);
    cf_poly1305_update((cf_poly1305 *)(tag._8_8_ + 0xe8),(uint8_t *)input,inlen - 0x10);
    *(size_t *)(tag._8_8_ + 0x1a0) = inlen - 0x10;
    chacha20poly1305_finalize((chacha20poly1305_context_t *)tag._8_8_,(uint8_t *)&ret);
    uVar1 = mem_eq(&ret,(void *)((long)input + (inlen - 0x10)),0x10);
    if (uVar1 == 0) {
      local_60 = (ptls_aead_context_t *)0xffffffffffffffff;
    }
    else {
      cf_chacha20_cipher((cf_chacha20_ctx *)(tag._8_8_ + 0x60),(uint8_t *)input,(uint8_t *)output,
                         inlen - 0x10);
      local_60 = (ptls_aead_context_t *)(inlen - 0x10);
    }
    (*ptls_clear_memory)(&ret,0x10);
    (*ptls_clear_memory)((void *)(tag._8_8_ + 0xe8),0xb0);
    _ctx_local = local_60;
  }
  return (size_t)_ctx_local;
}

Assistant:

static size_t chacha20poly1305_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, const void *iv,
                                       const void *aad, size_t aadlen)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;
    uint8_t tag[PTLS_CHACHA20POLY1305_TAG_SIZE];
    size_t ret;

    if (inlen < sizeof(tag))
        return SIZE_MAX;

    chacha20poly1305_init(&ctx->super, iv, aad, aadlen);

    cf_poly1305_update(&ctx->poly, input, inlen - sizeof(tag));
    ctx->textlen = inlen - sizeof(tag);

    chacha20poly1305_finalize(ctx, tag);
    if (mem_eq(tag, (const uint8_t *)input + inlen - sizeof(tag), sizeof(tag))) {
        cf_chacha20_cipher(&ctx->chacha, input, output, inlen - sizeof(tag));
        ret = inlen - sizeof(tag);
    } else {
        ret = SIZE_MAX;
    }

    ptls_clear_memory(tag, sizeof(tag));
    ptls_clear_memory(&ctx->poly, sizeof(ctx->poly));

    return ret;
}